

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O1

bool __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::windowEvent
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QEvent *event)

{
  qsizetype *this_00;
  int **this_01;
  ushort uVar1;
  QCursorData *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  QWidget *pQVar8;
  ulong uVar9;
  ulong uVar10;
  QPaintDevice *pQVar11;
  QMouseEvent *e;
  long in_FS_OFFSET;
  bool bVar12;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  undefined1 auVar21 [16];
  QRegion r;
  QCursor moved;
  QCursorData *local_50;
  QRegion local_48;
  Representation local_40;
  Representation RStack_3c;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  this_00 = &this[-1].movingSeparator.d.size;
  pQVar8 = QLayout::parentWidget((QLayout *)this_00);
  uVar1 = *(ushort *)(event + 8);
  bVar3 = true;
  if (uVar1 < 0x33) {
    uVar6 = 0x6e8450;
    switch(uVar1) {
    case 1:
      if (*(TimerId *)(event + 0x10) == (this->separatorMoveTimer).m_id) {
        uVar6 = QBasicTimer::stop();
        if (((this->movingSeparator).d.size != 0) &&
           (iVar4 = -(uint)((this->movingSeparatorPos).xp.m_i ==
                           (this->movingSeparatorOrigin).xp.m_i),
           iVar5 = -(uint)((this->movingSeparatorPos).yp.m_i == (this->movingSeparatorOrigin).yp.m_i
                          ), auVar13._4_4_ = iVar4, auVar13._0_4_ = iVar4, auVar13._8_4_ = iVar5,
           auVar13._12_4_ = iVar5, iVar4 = movmskpd(uVar6,auVar13), iVar4 != 3)) {
          pQVar8 = QLayout::parentWidget((QLayout *)this_00);
          this_01 = &this[1].hoverSeparator.d.ptr;
          QDockAreaLayoutInfo::separatorRegion((QDockAreaLayoutInfo *)&stack0xffffffffffffffc0);
          QWidget::update(pQVar8,(QRegion *)&stack0xffffffffffffffc0);
          QRegion::~QRegion((QRegion *)&stack0xffffffffffffffc0);
          QDockAreaLayoutInfo::operator=
                    ((QDockAreaLayoutInfo *)this_01,
                     (QDockAreaLayoutInfo *)&this[2].hoverSeparator.d.size);
          QDockAreaLayoutInfo::separatorMove
                    ((QDockAreaLayoutInfo *)this_01,&this->movingSeparator,
                     &this->movingSeparatorOrigin,&this->movingSeparatorPos);
          this->movingSeparatorPos = this->movingSeparatorOrigin;
        }
        goto LAB_004428d9;
      }
      break;
    case 2:
      if (*(int *)(event + 0x40) == 1) {
        uVar6 = QEventPoint::position();
        auVar14._0_8_ =
             (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM1_Qa;
        auVar14._8_8_ =
             (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM0_Qa;
        auVar21 = minpd(_DAT_0066f5d0,auVar14);
        auVar15._8_8_ = -(ulong)(-2147483648.0 < auVar21._8_8_);
        auVar15._0_8_ = -(ulong)(-2147483648.0 < auVar21._0_8_);
        uVar7 = movmskpd(uVar6,auVar15);
        uVar9 = 0x8000000000000000;
        if ((uVar7 & 1) != 0) {
          uVar9 = (ulong)(uint)(int)auVar21._0_8_ << 0x20;
        }
        uVar10 = 0x80000000;
        if ((uVar7 & 2) != 0) {
          uVar10 = (ulong)(uint)(int)auVar21._8_8_;
        }
        _local_40 = (QPoint)(uVar10 | uVar9);
        bVar12 = startSeparatorMove(this,(QPoint *)&stack0xffffffffffffffc0);
LAB_004427ee:
        if (bVar12 != false) goto LAB_00442823;
      }
      break;
    case 3:
      QEventPoint::position();
      if ((this->movingSeparator).d.size != 0) {
        QList<int>::clear(&this->movingSeparator);
        QDockAreaLayoutInfo::clear((QDockAreaLayoutInfo *)&this[2].hoverSeparator.d.size);
LAB_00442823:
        event[0xc] = (QEvent)0x1;
        goto LAB_004428d9;
      }
      break;
    case 5:
      auVar21 = QEventPoint::position();
      auVar16._0_8_ =
           (double)((ulong)auVar21._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar21._8_8_;
      auVar16._8_8_ =
           (double)((ulong)auVar21._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar21._0_8_;
      auVar21 = minpd(_DAT_0066f5d0,auVar16);
      auVar17._8_8_ = -(ulong)(-2147483648.0 < auVar21._8_8_);
      auVar17._0_8_ = -(ulong)(-2147483648.0 < auVar21._0_8_);
      uVar7 = movmskpd(uVar6,auVar17);
      uVar10 = (ulong)(uint)(int)auVar21._8_8_;
      uVar9 = (ulong)(uint)(int)auVar21._0_8_ << 0x20;
      if ((uVar7 & 1) == 0) {
        uVar9 = 0x8000000000000000;
      }
      if ((uVar7 & 2) == 0) {
        uVar10 = 0x80000000;
      }
      _local_40 = (QPoint)(uVar10 | uVar9);
      adjustCursor(this,(QPoint *)&stack0xffffffffffffffc0);
      if (((byte)event[0x44] & 1) != 0) {
        auVar21 = QEventPoint::position();
        auVar18._0_8_ =
             (double)((ulong)auVar21._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar21._8_8_;
        auVar18._8_8_ =
             (double)((ulong)auVar21._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar21._0_8_;
        auVar21 = minpd(_DAT_0066f5d0,auVar18);
        auVar19._8_8_ = -(ulong)(-2147483648.0 < auVar21._8_8_);
        auVar19._0_8_ = -(ulong)(-2147483648.0 < auVar21._0_8_);
        uVar7 = movmskpd(uVar7,auVar19);
        uVar9 = 0x8000000000000000;
        if ((uVar7 & 1) != 0) {
          uVar9 = (ulong)(uint)(int)auVar21._0_8_ << 0x20;
        }
        uVar10 = 0x80000000;
        if ((uVar7 & 2) != 0) {
          uVar10 = (ulong)(uint)(int)auVar21._8_8_;
        }
        _local_40 = (QPoint)(uVar10 | uVar9);
        bVar12 = separatorMove(this,(QPoint *)&stack0xffffffffffffffc0);
        goto LAB_004427ee;
      }
      break;
    case 0xc:
      _local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      pQVar11 = &pQVar8->super_QPaintDevice;
      if (pQVar8 == (QWidget *)0x0) {
        pQVar11 = (QPaintDevice *)0x0;
      }
      QPainter::QPainter((QPainter *)&stack0xffffffffffffffc0,pQVar11);
      local_48.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_48,(QRegion *)(event + 0x20));
      QDockAreaLayoutInfo::paintSeparators
                ((QDockAreaLayoutInfo *)&this[1].hoverSeparator.d.ptr,
                 (QPainter *)&stack0xffffffffffffffc0,pQVar8,&local_48,&this->hoverPos);
      QRegion::~QRegion(&local_48);
      QPainter::~QPainter((QPainter *)&stack0xffffffffffffffc0);
    }
  }
  else if (uVar1 < 0x80) {
    if (uVar1 == 0x33) {
      local_40.m_i = 0;
      RStack_3c.m_i = 0;
LAB_004428cf:
      adjustCursor(this,(QPoint *)&stack0xffffffffffffffc0);
    }
    else if (uVar1 == 0x7f) goto LAB_004428d9;
  }
  else {
    if (uVar1 == 0x80) {
      local_40.m_i = 0;
      RStack_3c.m_i = 0;
      adjustCursor(this,(QPoint *)&stack0xffffffffffffffc0);
      goto LAB_004428d9;
    }
    if (uVar1 == 0x81) {
      uVar6 = QEventPoint::position();
      auVar21._0_8_ =
           (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa_00;
      auVar21._8_8_ =
           (double)((ulong)extraout_XMM0_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa_00;
      auVar21 = minpd(_DAT_0066f5d0,auVar21);
      auVar20._8_8_ = -(ulong)(-2147483648.0 < auVar21._8_8_);
      auVar20._0_8_ = -(ulong)(-2147483648.0 < auVar21._0_8_);
      uVar7 = movmskpd(uVar6,auVar20);
      uVar9 = 0x8000000000000000;
      if ((uVar7 & 1) != 0) {
        uVar9 = (ulong)(uint)(int)auVar21._0_8_ << 0x20;
      }
      uVar10 = 0x80000000;
      if ((uVar7 & 2) != 0) {
        uVar10 = (ulong)(uint)(int)auVar21._8_8_;
      }
      _local_40 = (QPoint)(uVar10 | uVar9);
      goto LAB_004428cf;
    }
    if (uVar1 == 0xb7) {
      bVar3 = this->cursorAdjusted;
      if (bVar3 == true) {
        iVar4 = QCursor::shape();
        QWidget::cursor((QWidget *)&local_48);
        iVar5 = QCursor::shape();
        bVar12 = iVar4 != iVar5;
      }
      else {
        bVar12 = false;
      }
      if (bVar3 != false) {
        QCursor::~QCursor((QCursor *)&local_48);
      }
      if (bVar12) {
        QWidget::cursor((QWidget *)&local_50);
        pQVar2 = local_50;
        local_50 = (QCursorData *)0x0;
        _local_40 = (QPoint)(this->oldCursor).d;
        (this->oldCursor).d = pQVar2;
        QCursor::~QCursor((QCursor *)&stack0xffffffffffffffc0);
        QCursor::~QCursor((QCursor *)&local_50);
        bVar3 = QWidget::testAttribute_helper(pQVar8,WA_SetCursor);
        this->hasOldCursor = bVar3;
        QWidget::setCursor(pQVar8,&this->adjustedCursor);
      }
    }
  }
  bVar3 = false;
LAB_004428d9:
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutSeparatorHelper<Layout>::windowEvent(QEvent *event)
{
    QWidget *w = window();
    switch (event->type()) {
    case QEvent::Paint: {
        QPainter p(w);
        QRegion r = static_cast<QPaintEvent *>(event)->region();
        layout()->dockAreaLayoutInfo()->paintSeparators(&p, w, r, hoverPos);
        break;
    }

#if QT_CONFIG(cursor)
    case QEvent::HoverMove: {
        adjustCursor(static_cast<QHoverEvent *>(event)->position().toPoint());
        break;
    }

    // We don't want QWidget to call update() on the entire QMainWindow
    // on HoverEnter and HoverLeave, hence accept the event (return true).
    case QEvent::HoverEnter:
        return true;
    case QEvent::HoverLeave:
        adjustCursor(QPoint(0, 0));
        return true;
    case QEvent::ShortcutOverride: // when a menu pops up
        adjustCursor(QPoint(0, 0));
        break;
#endif // QT_CONFIG(cursor)

    case QEvent::MouseButtonPress: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);
        if (e->button() == Qt::LeftButton && startSeparatorMove(e->position().toPoint())) {
            // The click was on a separator, eat this event
            e->accept();
            return true;
        }
        break;
    }

    case QEvent::MouseMove: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);

#if QT_CONFIG(cursor)
        adjustCursor(e->position().toPoint());
#endif
        if (e->buttons() & Qt::LeftButton) {
            if (separatorMove(e->position().toPoint())) {
                // We're moving a separator, eat this event
                e->accept();
                return true;
            }
        }

        break;
    }

    case QEvent::MouseButtonRelease: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);
        if (endSeparatorMove(e->position().toPoint())) {
            // We've released a separator, eat this event
            e->accept();
            return true;
        }
        break;
    }

#if QT_CONFIG(cursor)
    case QEvent::CursorChange:
        // CursorChange events are triggered as mouse moves to new widgets even
        // if the cursor doesn't actually change, so do not change oldCursor if
        // the "changed" cursor has same shape as adjusted cursor.
        if (cursorAdjusted && adjustedCursor.shape() != w->cursor().shape()) {
            oldCursor = w->cursor();
            hasOldCursor = w->testAttribute(Qt::WA_SetCursor);

            // Ensure our adjusted cursor stays visible
            w->setCursor(adjustedCursor);
        }
        break;
#endif // QT_CONFIG(cursor)
    case QEvent::Timer:
        if (static_cast<QTimerEvent *>(event)->timerId() == separatorMoveTimer.timerId()) {
            // let's move the separators
            separatorMoveTimer.stop();
            if (movingSeparator.isEmpty())
                return true;
            if (movingSeparatorOrigin == movingSeparatorPos)
                return true;

            // when moving the separator, we need to update the previous position
            window()->update(layout()->dockAreaLayoutInfo()->separatorRegion());

            layout()->layoutState = layout()->savedState;
            layout()->dockAreaLayoutInfo()->separatorMove(movingSeparator, movingSeparatorOrigin,
                                                          movingSeparatorPos);
            movingSeparatorPos = movingSeparatorOrigin;
            return true;
        }
        break;
    default:
        break;
    }
    return false;
}